

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis_enc.c
# Opt level: O3

int DoSegmentsJob(void *arg1,void *arg2)

{
  int *piVar1;
  float fVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  int iVar5;
  uint uVar6;
  int max_value;
  VP8Histogram *pVVar7;
  bool bVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  uint32_t dc [16];
  uint8_t tmp [63];
  int local_dc;
  VP8Histogram local_c8 [8];
  undefined1 local_88 [2] [16];
  uint8_t auStack_60 [48];
  
  iVar5 = VP8IteratorIsDone((VP8EncIterator *)arg2);
  iVar12 = 1;
  if (iVar5 == 0) {
    do {
      VP8IteratorImport((VP8EncIterator *)arg2,auStack_60);
      lVar11 = *(long *)((long)arg2 + 0x28);
      VP8SetIntra16Mode((VP8EncIterator *)arg2,0);
      VP8SetSkip((VP8EncIterator *)arg2,0);
      VP8SetSegment((VP8EncIterator *)arg2,0);
      if (*(int *)(lVar11 + 0x5c40) < 2) {
        fVar2 = *(float *)(**(long **)((long)arg2 + 0x28) + 4);
        uVar9 = 0xfffffffffffffffc;
        lVar11 = 0;
        pVVar7 = local_c8;
        do {
          (*VP8Mean16x4)((uint8_t *)(*(long *)((long)arg2 + 8) + lVar11),(uint32_t *)pVVar7);
          uVar9 = uVar9 + 4;
          pVVar7 = pVVar7 + 2;
          lVar11 = lVar11 + 0x80;
        } while (uVar9 < 0xc);
        iVar15 = 0;
        iVar16 = 0;
        iVar17 = 0;
        iVar18 = 0;
        lVar11 = 0;
        iVar5 = 0;
        iVar12 = 0;
        iVar13 = 0;
        iVar14 = 0;
        do {
          auVar3 = *(undefined1 (*) [16])(&local_c8[0].max_value + lVar11);
          iVar19 = auVar3._0_4_;
          iVar5 = iVar5 + iVar19;
          iVar20 = auVar3._4_4_;
          iVar12 = iVar12 + iVar20;
          iVar13 = iVar13 + auVar3._8_4_;
          iVar21 = auVar3._12_4_;
          iVar14 = iVar14 + iVar21;
          iVar15 = iVar15 + iVar19 * iVar19;
          iVar16 = iVar16 + iVar20 * iVar20;
          iVar17 = iVar17 + (int)((auVar3._8_8_ & 0xffffffff) * (auVar3._8_8_ & 0xffffffff));
          iVar18 = iVar18 + iVar21 * iVar21;
          lVar11 = lVar11 + 4;
        } while (lVar11 != 0x10);
        iVar5 = iVar14 + iVar12 + iVar13 + iVar5;
        if ((uint)((((int)fVar2 * 9) / 100 + 8) * (iVar18 + iVar16 + iVar17 + iVar15)) <
            (uint)(iVar5 * iVar5)) {
          VP8SetIntra16Mode((VP8EncIterator *)arg2,0);
        }
        else {
          local_88[0] = (undefined1  [16])0x0;
          VP8SetIntra4Mode((VP8EncIterator *)arg2,(uint8_t *)local_88);
        }
        local_dc = 2;
      }
      else {
        VP8MakeLuma16Preds((VP8EncIterator *)arg2);
        iVar5 = -1;
        lVar10 = 0;
        lVar11 = 0;
        bVar4 = true;
        do {
          bVar8 = bVar4;
          local_c8[0].max_value = 0;
          local_c8[0].last_non_zero = 1;
          (*VP8CollectHistogram)
                    (*(uint8_t **)((long)arg2 + 8),
                     (uint8_t *)((ulong)VP8I16ModeOffsets[lVar10] + *(long *)((long)arg2 + 0x20)),0,
                     0x10,local_c8);
          iVar12 = 0;
          if (1 < local_c8[0].max_value) {
            iVar12 = (local_c8[0].last_non_zero * 0x1fe) / local_c8[0].max_value;
          }
          if (iVar5 < iVar12) {
            lVar11 = lVar10;
            iVar5 = iVar12;
          }
          lVar10 = 1;
          bVar4 = false;
        } while (bVar8);
        VP8SetIntra16Mode((VP8EncIterator *)arg2,(int)lVar11);
        local_dc = iVar5 * 3 + 2;
      }
      VP8MakeChroma8Preds((VP8EncIterator *)arg2);
      lVar11 = 0;
      iVar5 = -1;
      iVar13 = 0;
      bVar4 = true;
      iVar12 = 0;
      do {
        bVar8 = bVar4;
        local_c8[0].max_value = 0;
        local_c8[0].last_non_zero = 1;
        (*VP8CollectHistogram)
                  ((uint8_t *)(*(long *)((long)arg2 + 8) + 0x10),
                   (uint8_t *)((ulong)VP8UVModeOffsets[lVar11] + *(long *)((long)arg2 + 0x20)),0x10,
                   0x18,local_c8);
        iVar14 = 0;
        if (1 < local_c8[0].max_value) {
          iVar14 = (local_c8[0].last_non_zero * 0x1fe) / local_c8[0].max_value;
        }
        if (iVar5 < iVar14) {
          iVar5 = iVar14;
        }
        iVar15 = (int)lVar11;
        if (iVar13 <= iVar14 && !bVar8) {
          iVar14 = iVar13;
          iVar15 = iVar12;
        }
        iVar13 = iVar14;
        lVar11 = 1;
        bVar4 = false;
        iVar12 = iVar15;
      } while (bVar8);
      VP8SetIntraUVMode((VP8EncIterator *)arg2,iVar15);
      iVar12 = local_dc + iVar5 >> 2;
      uVar6 = 0xff - iVar12;
      if (0xfe < uVar6) {
        uVar6 = 0xff;
      }
      uVar9 = (ulong)uVar6;
      if (0xff < iVar12) {
        uVar9 = 0;
      }
      piVar1 = (int *)((long)arg1 + uVar9 * 4 + 0x30);
      *piVar1 = *piVar1 + 1;
      *(char *)(*(long *)((long)arg2 + 0x30) + 1) = (char)uVar9;
      *(int *)((long)arg1 + 0x430) = *(int *)((long)arg1 + 0x430) + (int)uVar9;
      *(int *)((long)arg1 + 0x434) = *(int *)((long)arg1 + 0x434) + iVar5;
      iVar12 = VP8IteratorProgress((VP8EncIterator *)arg2,*(int *)((long)arg1 + 0x1340));
    } while ((iVar12 != 0) && (iVar5 = VP8IteratorNext((VP8EncIterator *)arg2), iVar5 != 0));
  }
  return iVar12;
}

Assistant:

static int DoSegmentsJob(void* arg1, void* arg2) {
  SegmentJob* const job = (SegmentJob*)arg1;
  VP8EncIterator* const it = (VP8EncIterator*)arg2;
  int ok = 1;
  if (!VP8IteratorIsDone(it)) {
    uint8_t tmp[32 + WEBP_ALIGN_CST];
    uint8_t* const scratch = (uint8_t*)WEBP_ALIGN(tmp);
    do {
      // Let's pretend we have perfect lossless reconstruction.
      VP8IteratorImport(it, scratch);
      MBAnalyze(it, job->alphas, &job->alpha, &job->uv_alpha);
      ok = VP8IteratorProgress(it, job->delta_progress);
    } while (ok && VP8IteratorNext(it));
  }
  return ok;
}